

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O1

Node * __thiscall
cali::internal::MetadataTree::get_path
          (MetadataTree *this,Attribute *attr,size_t n,Variant *data,Node *parent)

{
  bool bVar1;
  Node *pNVar2;
  cali_id_t attr_00;
  size_t sVar3;
  size_t sVar4;
  
  pNVar2 = parent;
  if (parent == (Node *)0x0) {
    pNVar2 = (Node *)((long)mG._M_b._M_p + 0x10);
  }
  sVar3 = 0;
  sVar4 = sVar3;
  if (n != 0) {
    do {
      parent = pNVar2;
      pNVar2 = *(Node **)((long)&((parent->super_LockfreeIntrusiveTree<cali::Node>).m_me)->m_id +
                         (parent->super_LockfreeIntrusiveTree<cali::Node>).m_node);
      if (pNVar2 == (Node *)0x0) {
LAB_001f766f:
        pNVar2 = (Node *)0x0;
        sVar4 = sVar3;
        break;
      }
      while( true ) {
        if (attr->m_node == (Node *)0x0) {
          attr_00 = 0xffffffffffffffff;
        }
        else {
          attr_00 = attr->m_node->m_id;
        }
        bVar1 = Node::equals(pNVar2,attr_00,data + sVar3);
        if (bVar1) break;
        pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                   super_LockfreeIntrusiveTree<cali::Node>).m_node +
                           (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
        if (pNVar2 == (Node *)0x0) goto LAB_001f766f;
      }
      sVar3 = sVar3 + 1;
      sVar4 = n;
    } while (sVar3 != n);
  }
  if (pNVar2 == (Node *)0x0) {
    pNVar2 = create_path(this,attr,n - sVar4,data + sVar4,parent);
    return pNVar2;
  }
  return pNVar2;
}

Assistant:

Node* MetadataTree::get_path(const Attribute& attr, size_t n, const Variant* data, Node* parent = nullptr)
{
    Node*  node = parent ? parent : &(mG.load()->root);
    size_t base = 0;

    for (size_t i = 0; i < n; ++i) {
        parent = node;

        for (node = parent->first_child(); node && !node->equals(attr.id(), data[i]); node = node->next_sibling())
            ;

        if (!node)
            break;

        ++base;
    }

    if (!node)
        node = create_path(attr, n - base, data + base, parent);

    return node;
}